

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint * str_to_vector(uchar *s,uint s_len)

{
  uint *puVar1;
  uint local_24;
  uint i;
  uint *v;
  uint s_len_local;
  uchar *s_local;
  
  puVar1 = vector_new(s_len);
  for (local_24 = 0; local_24 < s_len; local_24 = local_24 + 1) {
    puVar1[local_24] = (uint)s[local_24];
  }
  return puVar1;
}

Assistant:

uint32_t *str_to_vector(uint8_t *s, uint32_t s_len)
{
    uint32_t *v = vector_new(s_len);
    for (uint32_t i = 0; i < s_len; i++)
        v[i] = ((uint32_t)s[i] < 0) ? 256 + s[i] : s[i];
    return v;
}